

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timestamp.cpp
# Opt level: O2

timestamp_t __thiscall duckdb::timestamp_t::operator+(timestamp_t *this,double *value)

{
  bool bVar1;
  OutOfRangeException *this_00;
  allocator local_41;
  timestamp_t result;
  string local_38;
  
  bVar1 = TryAddOperator::Operation<long,long,long>(this->value,(long)*value,&result.value);
  if (bVar1) {
    return (timestamp_t)result.value;
  }
  this_00 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string((string *)&local_38,"Overflow in timestamp addition",&local_41);
  OutOfRangeException::OutOfRangeException(this_00,&local_38);
  __cxa_throw(this_00,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

timestamp_t timestamp_t::operator+(const double &value) const {
	timestamp_t result;
	if (!TryAddOperator::Operation(this->value, int64_t(value), result.value)) {
		throw OutOfRangeException("Overflow in timestamp addition");
	}
	return result;
}